

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O1

void fdb_gather_stale_blocks
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,bid_t prev_hdr,
               uint64_t kv_info_offset,fdb_seqnum_t seqnum,list_elem *e_last,bool from_mergetree)

{
  uint uVar1;
  btreeblk_handle *pbVar2;
  filemgr *pfVar3;
  avl_node *paVar4;
  list_elem *plVar5;
  docio_handle *handle_00;
  btree *btree;
  ulong *__ptr;
  list *plVar6;
  avl_node *node;
  list *plVar7;
  list_elem *e;
  size_t sVar8;
  bid_t doc_offset;
  byte bVar9;
  undefined7 uVar11;
  long lVar10;
  uint uVar12;
  char *pcVar13;
  char *__s;
  ulong uVar14;
  bool bVar15;
  undefined8 auStack_120 [4];
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  kvs_stat stat;
  filemgr_header_revnum_t _revnum;
  undefined1 auStack_98 [8];
  docio_object doc;
  ulong local_58;
  bid_t _doc_offset;
  undefined4 local_44;
  ulong local_40;
  uint local_38;
  byte local_31;
  
  if (handle->file->stale_list == (list *)0x0) {
    btreeblk_reset_subblock_info(handle->bhandle);
    return;
  }
  local_31 = from_mergetree;
  _doc_offset = (bid_t)e_last;
  _kvs_stat_get(handle->file,0,(kvs_stat *)local_f8);
  pbVar2 = handle->bhandle;
  pbVar2->nlivenodes = (int64_t)local_f8;
  pbVar2->ndeltanodes = (int64_t)local_f8;
  __ptr = (ulong *)calloc(1,0x2000);
  stat.deltasize =
       revnum >> 0x38 | (revnum & 0xff000000000000) >> 0x28 | (revnum & 0xff0000000000) >> 0x18 |
       (revnum & 0xff00000000) >> 8 | (revnum & 0xff000000) << 8 | (revnum & 0xff0000) << 0x18 |
       (revnum & 0xff00) << 0x28 | revnum << 0x38;
  *__ptr = 0xffffffffffffffff;
  uVar14 = 0xffffffffffffffff;
  if (1 < prev_hdr + 1) {
    uVar14 = prev_hdr >> 0x38 | (prev_hdr & 0xff000000000000) >> 0x28 |
             (prev_hdr & 0xff0000000000) >> 0x18 | (prev_hdr & 0xff00000000) >> 8 |
             (prev_hdr & 0xff000000) << 8 | (prev_hdr & 0xff0000) << 0x18 |
             (prev_hdr & 0xff00) << 0x28 | prev_hdr << 0x38;
  }
  __ptr[1] = uVar14;
  __ptr[2] = kv_info_offset >> 0x38 | (kv_info_offset & 0xff000000000000) >> 0x28 |
             (kv_info_offset & 0xff0000000000) >> 0x18 | (kv_info_offset & 0xff00000000) >> 8 |
             (kv_info_offset & 0xff000000) << 8 | (kv_info_offset & 0xff0000) << 0x18 |
             (kv_info_offset & 0xff00) << 0x28 | kv_info_offset << 0x38;
  __ptr[3] = seqnum >> 0x38 | (seqnum & 0xff000000000000) >> 0x28 |
             (seqnum & 0xff0000000000) >> 0x18 | (seqnum & 0xff00000000) >> 8 |
             (seqnum & 0xff000000) << 8 | (seqnum & 0xff0000) << 0x18 | (seqnum & 0xff00) << 0x28 |
             seqnum << 0x38;
  plVar6 = (list *)(_doc_offset + 8);
  uVar14 = 0x2000;
  uVar11 = (undefined7)((ulong)stat.deltasize >> 8);
  bVar9 = 1;
  uVar12 = 0;
  pcVar13 = local_f8;
  do {
    local_44 = (undefined4)CONCAT71(uVar11,bVar9 & local_31);
    if ((bVar9 & local_31) == 1) {
      pfVar3 = handle->file;
      *(undefined8 *)(pcVar13 + -8) = 0x133daf;
      node = avl_first(&pfVar3->mergetree);
      if (node == (avl_node *)0x0) {
LAB_00133ee5:
        local_40 = 0x24;
      }
      else {
        local_40 = 0x24;
        do {
          if (handle->staletree != (btree *)0x0) {
            uVar12 = uVar12 + 1;
            paVar4 = node[-1].left;
            uVar1 = *(uint *)&node[-1].right;
            *(ulong *)((long)__ptr + (local_40 & 0xffffffff)) =
                 (ulong)paVar4 >> 0x38 | ((ulong)paVar4 & 0xff000000000000) >> 0x28 |
                 ((ulong)paVar4 & 0xff0000000000) >> 0x18 | ((ulong)paVar4 & 0xff00000000) >> 8 |
                 ((ulong)paVar4 & 0xff000000) << 8 | ((ulong)paVar4 & 0xff0000) << 0x18 |
                 ((ulong)paVar4 & 0xff00) << 0x28 | (long)paVar4 << 0x38;
            *(uint *)((long)__ptr + (ulong)((int)local_40 + 8)) =
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
            local_40 = (ulong)((int)local_40 + 0xc);
            if (uVar14 <= local_40 + 0xc) {
              uVar14 = (ulong)(uint)((int)uVar14 * 2);
              *(undefined8 *)(pcVar13 + -8) = 0x133e0c;
              __ptr = (ulong *)realloc(__ptr,uVar14);
            }
          }
          *(undefined8 *)(pcVar13 + -8) = 0x133e17;
          node = avl_next(node);
        } while (node != (avl_node *)0x0);
      }
    }
    else {
      plVar7 = plVar6;
      if (_doc_offset == 0) {
        plVar7 = handle->file->stale_list;
      }
      e = plVar7->head;
      if (e == (list_elem *)0x0) goto LAB_00133ee5;
      local_40 = 0x24;
      local_38 = uVar12;
      do {
        if (handle->staletree != (btree *)0x0) {
          local_38 = local_38 + 1;
          plVar5 = e[-1].prev;
          uVar12 = *(uint *)&e[-1].next;
          *(ulong *)((long)__ptr + (local_40 & 0xffffffff)) =
               (ulong)plVar5 >> 0x38 | ((ulong)plVar5 & 0xff000000000000) >> 0x28 |
               ((ulong)plVar5 & 0xff0000000000) >> 0x18 | ((ulong)plVar5 & 0xff00000000) >> 8 |
               ((ulong)plVar5 & 0xff000000) << 8 | ((ulong)plVar5 & 0xff0000) << 0x18 |
               ((ulong)plVar5 & 0xff00) << 0x28 | (long)plVar5 << 0x38;
          *(uint *)((long)__ptr + (ulong)((int)local_40 + 8)) =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          local_40 = (ulong)((int)local_40 + 0xc);
          if (uVar14 <= local_40 + 0xc) {
            uVar14 = (ulong)(uint)((int)uVar14 * 2);
            *(undefined8 *)(pcVar13 + -8) = 0x133ea0;
            __ptr = (ulong *)realloc(__ptr,uVar14);
          }
        }
        plVar5 = e + -1;
        plVar7 = handle->file->stale_list;
        *(undefined8 *)(pcVar13 + -8) = 0x133ec9;
        e = list_remove(plVar7,e);
        *(undefined8 *)(pcVar13 + -8) = 0x133ed4;
        free(plVar5);
        uVar12 = local_38;
      } while (e != (list_elem *)0x0);
    }
    if (uVar12 == 0) {
      bVar15 = false;
      uVar12 = 0;
      __s = pcVar13;
    }
    else {
      __s = pcVar13 + -0x20;
      *(uint *)(__ptr + 4) =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      doc.meta = (void *)0x0;
      doc.key = (void *)0x0;
      doc.field_3.seqnum = 0;
      doc.length.bodylen_ondisk = 0;
      doc.length.flag = '\0';
      doc.length.checksum = '\0';
      doc.length.reserved = 0;
      doc.timestamp = 0;
      doc._20_4_ = 0;
      auStack_98._0_2_ = 0;
      auStack_98._2_2_ = 0;
      auStack_98._4_4_ = 0;
      doc.length.keylen = 0;
      doc.length.metalen = 0;
      doc.length.bodylen = 0;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133f5a;
      sprintf(__s,"stale_blocks_%lu",revnum);
      *(undefined8 *)(pcVar13 + -0x28) = 0x133f6a;
      doc._16_8_ = __s;
      doc.meta = __ptr;
      sVar8 = strlen(__s);
      auStack_98._2_2_ = 0;
      auStack_98._0_2_ = (short)sVar8 + 1;
      auStack_98._4_4_ = (uint32_t)local_40;
      doc.key = (void *)0x0;
      handle_00 = handle->dhandle;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133fa2;
      local_38 = uVar12;
      doc_offset = docio_append_doc_system(handle_00,(docio_object *)auStack_98);
      local_58 = doc_offset >> 0x38 | (doc_offset & 0xff000000000000) >> 0x28 |
                 (doc_offset & 0xff0000000000) >> 0x18 | (doc_offset & 0xff00000000) >> 8 |
                 (doc_offset & 0xff000000) << 8 | (doc_offset & 0xff0000) << 0x18 |
                 (doc_offset & 0xff00) << 0x28 | doc_offset << 0x38;
      btree = handle->staletree;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133fc0;
      btree_insert(btree,&stat.deltasize,&local_58);
      pbVar2 = handle->bhandle;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133fc9;
      btreeblk_end(pbVar2);
      pbVar2 = handle->bhandle;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133fd2;
      btreeblk_reset_subblock_info(pbVar2);
      uVar12 = local_38;
      *(undefined8 *)(pcVar13 + -0x28) = 0x133feb;
      fdb_add_inmem_stale_info(handle,revnum,(docio_object *)auStack_98,doc_offset,local_44._0_1_);
      bVar15 = handle->file->stale_list->head != (list_elem *)0x0;
      if (bVar15) {
        *__ptr = local_58;
        uVar12 = 0;
      }
    }
    bVar9 = 0;
    uVar11 = 0;
    pcVar13 = __s;
    if (!bVar15) {
      pfVar3 = handle->file;
      lVar10 = handle->bhandle->nlivenodes - (long)local_f8;
      builtin_strncpy(__s + -8,"=@\x13",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      _kvs_stat_update_attr(pfVar3,0,KVS_STAT_NLIVENODES,lVar10);
      pfVar3 = handle->file;
      lVar10 = handle->bhandle->ndeltanodes;
      uVar12 = (handle->config).blocksize;
      builtin_strncpy(__s + -8,"d@\x13",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      _kvs_stat_update_attr(pfVar3,0,KVS_STAT_DELTASIZE,(ulong)uVar12 * (lVar10 - (long)local_f8));
      builtin_strncpy(__s + -8,"l@\x13",4);
      __s[-4] = '\0';
      __s[-3] = '\0';
      __s[-2] = '\0';
      __s[-1] = '\0';
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void fdb_gather_stale_blocks(fdb_kvs_handle *handle,
                             filemgr_header_revnum_t revnum,
                             bid_t prev_hdr,
                             uint64_t kv_info_offset,
                             fdb_seqnum_t seqnum,
                             struct list_elem *e_last,
                             bool from_mergetree)
{
    int64_t delta;
    int r;
    uint32_t count = 0;
    uint32_t offset = 0, count_location;
    uint32_t bufsize = 8192;
    uint32_t _count, _len;
    uint64_t _pos, _kv_info_offset;
    uint8_t *buf = NULL;
    bid_t doc_offset, _doc_offset;
    bid_t _prev_hdr;
    bool gather_staleblocks = true;
    bool first_loop = true;
    filemgr_header_revnum_t _revnum;
    fdb_seqnum_t _seqnum;
    struct kvs_stat stat;

    /*
     * << stale block system doc structure >>
     * [previous doc offset]: 8 bytes (0xffff.. if not exist)
     * [previous header BID]: 8 bytes (0xffff.. if not exist)
     * [KVS info doc offset]: 8 bytes (0xffff.. if not exist)
     * [Default KVS seqnum]:  8 bytes
     * [# items]:             4 bytes
     * ---
     * [position]:            8 bytes
     * [length]:              4 bytes
     * ...
     */

    if (filemgr_get_stale_list(handle->file)) {
        struct avl_node *a;
        struct list_elem *e;
        struct stale_data *item;

        r = _kvs_stat_get(handle->file, 0, &stat);
        handle->bhandle->nlivenodes = stat.nlivenodes;
        handle->bhandle->ndeltanodes = stat.nlivenodes;
        (void)r;

        buf = (uint8_t *)calloc(1, bufsize);
        _revnum = _endian_encode(revnum);

        // initial previous doc offset
        memset(buf, 0xff, sizeof(bid_t));
        count_location = sizeof(bid_t);

        // previous header BID
        if (prev_hdr == 0 || prev_hdr == BLK_NOT_FOUND) {
            // does not exist
            memset(&_prev_hdr, 0xff, sizeof(_prev_hdr));
        } else {
            _prev_hdr = _endian_encode(prev_hdr);
        }
        memcpy(buf + sizeof(bid_t), &_prev_hdr, sizeof(bid_t));
        count_location += sizeof(bid_t);

        // KVS info doc offset
        _kv_info_offset = _endian_encode(kv_info_offset);
        memcpy(buf + count_location, &_kv_info_offset, sizeof(uint64_t));
        count_location += sizeof(uint64_t);

        // default KVS seqnum
        _seqnum = _endian_encode(seqnum);
        memcpy(buf + count_location, &_seqnum, sizeof(fdb_seqnum_t));
        count_location += sizeof(fdb_seqnum_t);
        count_location += sizeof(count);

        while(gather_staleblocks) {
            // reserve space for
            // prev offset (8), prev header (8), kv_info_offset (8),
            // seqnum (8), count (4)
            offset = count_location;

            if (first_loop && from_mergetree) {
                // gather from mergetree
                a = avl_first(&handle->file->mergetree);
                while (a) {
                    item = _get_entry(a, struct stale_data, avl);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }


                    // If 'from_mergetree' flag is set, it means that this
                    // function is called at the end of fdb_get_reusable_block(),
                    // and those items are remaining (non-reusable) regions after
                    // picking up reusable blocks from 'mergetree'.

                    // In the previous implementation, those items are converted
                    // and stored as a system document. The document is re-read in
                    // the next block reclaim, and then we reconstruct 'mergetree'
                    // from the document; this is unnecessary duplicated overhead.

                    // As an optimization, we can simply keep those items in
                    // 'mergetree' and use them in the next block reclaim, without
                    // reading the corresponding system document; this also reduces
                    // the commit latency much. Instead, to minimize memory
                    // consumption, we don't need to maintain in-memory copy of the
                    // system doc corresponding to the remaining items in the
                    // 'mergetree', that will be created below.

                    // do not remove the item
                    a = avl_next(&item->avl);
                }
            } else {
                // gater from stale_list
                if (e_last) {
                    e = list_next(e_last);
                } else {
                    e = list_begin(handle->file->stale_list);
                }
                while (e) {
                    item = _get_entry(e, struct stale_data, le);

                    if (handle->staletree) {
                        count++;

                        _pos = _endian_encode(item->pos);
                        _len = _endian_encode(item->len);

                        memcpy(buf + offset, &_pos, sizeof(_pos));
                        offset += sizeof(_pos);
                        memcpy(buf + offset, &_len, sizeof(_len));
                        offset += sizeof(_len);

                        if (offset + sizeof(_pos) + sizeof(_len) >= bufsize) {
                            bufsize *= 2;
                            buf = (uint8_t*)realloc(buf, bufsize);
                        }
                    }

                    e = list_remove(handle->file->stale_list, e);
                    free(item);
                }
            }

            gather_staleblocks = false;
            if (count) {
                char *doc_key = alca(char, 32);
                struct docio_object doc;

                // store count
                _count = _endian_encode(count);
                memcpy(buf + count_location - sizeof(_count), &_count, sizeof(_count));

                // append a system doc
                memset(&doc, 0x0, sizeof(doc));
                // add one to 'revnum' to get the next revision number
                // (note that filemgr_mutex() is grabbed so that no other thread
                //  will change the 'revnum').
                sprintf(doc_key, "stale_blocks_%" _F64, revnum);
                doc.key = (void*)doc_key;
                doc.body = buf;
                doc.length.keylen = strlen(doc_key) + 1;
                doc.length.metalen = 0;
                doc.length.bodylen = offset;
                doc.seqnum = 0;
                doc_offset = docio_append_doc_system(handle->dhandle, &doc);

                // insert into stale-block tree
                _doc_offset = _endian_encode(doc_offset);
                btree_insert(handle->staletree, (void *)&_revnum, (void *)&_doc_offset);
                btreeblk_end(handle->bhandle);
                btreeblk_reset_subblock_info(handle->bhandle);

                if (from_mergetree && first_loop) {
                    // if from_mergetree flag is set and this is the first loop,
                    // stale regions in this document are already in mergetree
                    // so skip adding them into in-memory stale info tree.

                    // however, the system doc itself should be marked as stale
                    // when the doc is reclaimed, thus we instead add a dummy entry
                    // that containing doc offset, length info only.
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, true);
                } else {
                    // add the doc into in-memory stale info tree
                    fdb_add_inmem_stale_info(handle, revnum, &doc, doc_offset, false);
                }

                if (list_begin(filemgr_get_stale_list(handle->file))) {
                    // updating stale tree brings another stale blocks.
                    // recursively update until there is no more stale block.

                    // note that infinite loop will not occur because
                    // 1) all updated index blocks for stale tree are still writable
                    // 2) incoming keys for stale tree (revnum) are monotonic
                    //    increasing order; most recently allocated node will be
                    //    updated again.

                    count = 0;
                    // save previous doc offset
                    memcpy(buf, &_doc_offset, sizeof(_doc_offset));

                    // gather once again
                    gather_staleblocks = true;
                }
            }

            first_loop = false;
        } // gather stale blocks

        delta = handle->bhandle->nlivenodes - stat.nlivenodes;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_NLIVENODES, delta);
        delta = handle->bhandle->ndeltanodes - stat.nlivenodes;
        delta *= handle->config.blocksize;
        _kvs_stat_update_attr(handle->file, 0, KVS_STAT_DELTASIZE, delta);

        free(buf);
    } else {
        btreeblk_reset_subblock_info(handle->bhandle);
    }
}